

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q8_0_ref(float *x,block_q8_0 *y,int64_t k)

{
  ggml_fp16_t gVar1;
  float f;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  float x0;
  int j_1;
  float id;
  float d;
  float v;
  int j;
  float amax;
  int i;
  int nb;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  
  f = (float)(in_RDX / 0x20);
  for (local_20 = 0; local_20 < (int)f; local_20 = local_20 + 1) {
    local_24 = 0.0;
    for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
      local_40 = *(float *)(in_RDI + (long)(local_20 * 0x20 + local_28) * 4);
      if (local_24 <= ABS(local_40)) {
        local_40 = ABS(local_40);
      }
      else {
        local_40 = local_24;
      }
      local_24 = local_40;
    }
    local_24 = local_24 / 127.0;
    if ((local_24 != 0.0) || (NAN(local_24))) {
      local_44 = 1.0 / local_24;
    }
    else {
      local_44 = 0.0;
    }
    gVar1 = ggml_compute_fp32_to_fp16(f);
    *(ggml_fp16_t *)(in_RSI + (long)local_20 * 0x22) = gVar1;
    for (local_38 = 0; local_38 < 0x20; local_38 = local_38 + 1) {
      fVar2 = roundf(*(float *)(in_RDI + (long)(local_20 * 0x20 + local_38) * 4) * local_44);
      *(char *)(in_RSI + (long)local_20 * 0x22 + 2 + (long)local_38) = (char)(int)fVar2;
    }
  }
  return;
}

Assistant:

void quantize_row_q8_0_ref(const float * GGML_RESTRICT x, block_q8_0 * GGML_RESTRICT y, int64_t k) {
    assert(k % QK8_0 == 0);
    const int nb = k / QK8_0;

    for (int i = 0; i < nb; i++) {
        float amax = 0.0f; // absolute max

        for (int j = 0; j < QK8_0; j++) {
            const float v = x[i*QK8_0 + j];
            amax = MAX(amax, fabsf(v));
        }

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        for (int j = 0; j < QK8_0; ++j) {
            const float x0 = x[i*QK8_0 + j]*id;

            y[i].qs[j] = roundf(x0);
        }
    }
}